

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.cpp
# Opt level: O1

void CIF::makeSuperCell(Reader *cif,Vector3d *uvw,Vector3d *abc,Vector3d *widths,Vector3d *tilts,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *A,vector<double,_std::allocator<double>_> *x,
                       vector<double,_std::allocator<double>_> *y,
                       vector<double,_std::allocator<double>_> *z,
                       vector<double,_std::allocator<double>_> *occ,
                       vector<double,_std::allocator<double>_> *ux,
                       vector<double,_std::allocator<double>_> *uy,
                       vector<double,_std::allocator<double>_> *uz)

{
  double *pdVar1;
  pointer pMVar2;
  pointer pMVar3;
  pointer pbVar4;
  pointer pAVar5;
  long lVar6;
  runtime_error *prVar7;
  ulong uVar8;
  pointer pAVar9;
  size_type __new_size;
  ulong uVar10;
  int iVar11;
  pointer pbVar12;
  pointer pdVar13;
  undefined1 auVar14 [16];
  pointer pdVar15;
  pointer pMVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  pointer pMVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  initializer_list<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> __l;
  Vector3i mins;
  AtomSite at;
  vector<double,_std::allocator<double>_> pos;
  Matrix3d za_rotation;
  CellGeometry geom;
  UnitCell cell;
  Matrix3d z_rotation;
  Matrix3d y_rotation;
  Matrix3d x_rotation;
  ulong local_5b0;
  Vector3i local_5a4;
  pointer local_598;
  pointer pdStack_590;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_580;
  pointer local_568;
  undefined8 uStack_560;
  pointer local_558;
  pointer pMStack_550;
  pointer local_548;
  pointer pvStack_540;
  pointer local_538;
  pointer pMStack_530;
  ulong local_528;
  Vector3d *local_520;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_518;
  Vector3i local_4fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_4f0;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  AtomSite local_4d8;
  vector<double,_std::allocator<double>_> local_460;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> local_430;
  pointer local_418;
  pointer pvStack_410;
  Matrix3d local_408;
  pointer local_3b8;
  pointer pdStack_3b0;
  pointer local_3a8;
  pointer pvStack_3a0;
  AtomSite *local_398;
  AtomSite *local_390;
  pointer local_388;
  pointer local_380;
  pointer local_378;
  undefined8 uStack_370;
  pointer local_368;
  undefined8 uStack_360;
  pointer local_358;
  undefined8 uStack_350;
  pointer local_348;
  undefined8 uStack_340;
  pointer local_338;
  undefined8 uStack_330;
  pointer local_328;
  undefined8 uStack_320;
  CellGeometry local_310;
  UnitCell local_298;
  Matrix3d local_208;
  Matrix3d local_1b8;
  Matrix3d local_168;
  Vector3d local_118;
  undefined1 local_f8 [16];
  double local_e8;
  Vector3d local_d8;
  Vector3d local_b8;
  Vector3d local_98;
  Vector3d local_78;
  Vector3d local_60;
  Vector3d local_48;
  
  local_520 = widths;
  local_4f0 = A;
  Reader::getUnitCell(&local_298,cif);
  UnitCell::getCellGeometry(&local_310,&local_298);
  std::vector<double,_std::allocator<double>_>::vector(&local_4d8.occupancy,&local_310.avec);
  local_598 = (pointer)*local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
  pdStack_590 = (pointer)local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[1];
  pdVar13 = (pointer)local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start[2];
  operator_delete(local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  std::vector<double,_std::allocator<double>_>::vector(&local_4d8.occupancy,&local_310.bvec);
  local_538 = (pointer)*local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
  pMStack_530 = (pointer)local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[1];
  local_568 = (pointer)local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[2];
  uStack_560 = 0;
  operator_delete(local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  std::vector<double,_std::allocator<double>_>::vector(&local_4d8.occupancy,&local_310.cvec);
  local_548 = (pointer)*local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
  pvStack_540 = (pointer)local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[1];
  local_558 = (pointer)local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[2];
  operator_delete(local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = local_598;
  local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdStack_590;
  local_4d8.thermal_u.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_538;
  local_4d8.thermal_u.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMStack_530;
  local_4d8.thermal_u.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_568;
  local_4d8.positions.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_548;
  local_4d8.positions.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvStack_540;
  local_4d8.positions.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_558;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_4d8;
  local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar13;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&local_580,__l,(allocator_type *)&local_408);
  dVar22 = (uvw->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
  dVar21 = (uvw->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  dVar19 = (uvw->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       dVar19 * (double)local_548 + dVar21 * (double)local_538 + dVar22 * (double)local_598;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       dVar19 * (double)pvStack_540 + dVar21 * (double)pMStack_530 + dVar22 * (double)pdStack_590;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)local_568 * dVar21 + (double)pdVar13 * dVar22 + (double)local_558 * dVar19;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       1.0;
  Utilities::generateNormalisedRotationMatrix<double>(&local_408,&local_78,&local_98);
  if ((((((NAN(local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0])) ||
         (NAN(local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1]))) ||
        (NAN(local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2]))) ||
       ((NAN(local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3]) ||
        (NAN(local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4]))))) ||
      ((NAN(local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5]) ||
       ((NAN(local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6]) ||
        (NAN(local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7]))))))) ||
     (NAN(local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[8]))) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Zone axis rotation matrix contains NaNs");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar22 = (abc->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
  if ((((dVar22 == 0.0) && (!NAN(dVar22))) &&
      (dVar21 = (abc->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                .array[1], dVar21 == 0.0)) && (!NAN(dVar21))) {
    dVar21 = (abc->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[2];
    if ((dVar21 == 0.0) && (!NAN(dVar21))) {
      local_418 = (pointer)0x0;
      pvStack_410 = (pointer)0x0;
      local_3a8 = (pointer)0x3ff0000000000000;
      local_3b8 = (pointer)0x0;
      pMVar16 = (pointer)0x0;
      pMVar20 = (pointer)0x0;
      pMStack_550 = (pointer)0x3ff0000000000000;
      pdVar13 = (pointer)0x3ff0000000000000;
      pdVar15 = (pointer)0x0;
      goto LAB_001331a1;
    }
  }
  dVar21 = (abc->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  dVar19 = (abc->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  dVar24 = (double)local_548 * dVar19 + (double)local_538 * dVar21 + (double)local_598 * dVar22;
  dVar25 = (double)pvStack_540 * dVar19 +
           (double)pMStack_530 * dVar21 + (double)pdStack_590 * dVar22;
  dVar21 = (double)local_568 * dVar21 + (double)pdVar13 * dVar22 + (double)local_558 * dVar19;
  dVar22 = dVar21 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[6] +
           dVar25 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[3] +
           dVar24 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[0];
  auVar23._8_8_ =
       dVar21 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[7] +
       dVar25 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[4] +
       dVar24 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1];
  if (ABS(dVar22) < 1e-15) {
    dVar22 = 0.0;
  }
  auVar23._0_8_ = dVar22;
  auVar17._0_8_ = ABS(auVar23._8_8_);
  auVar17._8_8_ = ABS(auVar23._8_8_);
  if (auVar17._0_8_ < 1e-15) {
    auVar23._8_8_ = 0.0;
  }
  auVar14._0_8_ = auVar23._8_8_ * auVar23._8_8_ + auVar23._0_8_ * auVar23._0_8_;
  if (auVar14._0_8_ <= 0.0) {
    dVar22 = -0.0;
    auVar17 = auVar23;
  }
  else {
    auVar14._8_8_ = 0;
    auVar17 = sqrtpd(auVar17,auVar14);
    auVar18._0_8_ = auVar17._0_8_;
    dVar22 = -0.0 / auVar18._0_8_;
    auVar18._8_8_ = auVar18._0_8_;
    auVar17 = divpd(auVar23,auVar18);
  }
  dVar19 = auVar17._0_8_;
  dVar24 = auVar17._8_8_;
  dVar21 = dVar22 * dVar22 + dVar24 * dVar24 + dVar19 * dVar19;
  if (1.0 <= dVar21) {
    dVar21 = 1.0;
  }
  if ((0.0 - dVar22) * (0.0 - dVar22) +
      (dVar24 + 0.0) * (dVar24 + 0.0) + (dVar19 + 1.0) * (dVar19 + 1.0) <= dVar21 * 1e-24) {
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = 1.0;
    Utilities::generateRotationMatrix<double>((Matrix3d *)&local_4d8,&local_b8,3.141592653589793);
    local_418 = local_4d8.positions.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pvStack_410 = local_4d8.positions.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_3a8 = local_4d8.positions.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_3b8 = local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    pMVar16 = local_4d8.thermal_u.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pMVar20 = local_4d8.thermal_u.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMStack_550 = local_4d8.thermal_u.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    pdVar13 = local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar15 = local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 1.0;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = 0.0;
    local_e8 = 0.0;
    local_f8 = auVar23;
    Utilities::generateNormalisedRotationMatrix<double>
              ((Matrix3d *)&local_4d8,&local_d8,(Vector3d *)local_f8);
    local_418 = local_4d8.positions.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pvStack_410 = local_4d8.positions.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_3a8 = local_4d8.positions.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_3b8 = local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    pMVar16 = local_4d8.thermal_u.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pMVar20 = local_4d8.thermal_u.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMStack_550 = local_4d8.thermal_u.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    pdVar13 = local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar15 = local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
LAB_001331a1:
  if (((((NAN((double)pdVar13)) || (NAN((double)pdVar15))) ||
       ((NAN((double)local_3b8) ||
        (((NAN((double)pMVar20) || (NAN((double)pMStack_550))) || (NAN((double)pMVar16))))))) ||
      ((NAN((double)local_418) || (NAN((double)pvStack_410))))) || (NAN((double)local_3a8))) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Normal rotation matrix contains NaNs");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvStack_3a0 = (pointer)0x0;
  local_598 = (pointer)(tilts->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array[1];
  local_568 = (pointer)((tilts->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[2] * 3.141592653589793);
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_558 = pMVar20;
  local_548 = (pointer)pdVar13;
  pvStack_540 = (pointer)pdVar15;
  local_538 = pMVar16;
  Utilities::generateRotationMatrix<double>
            (&local_168,&local_48,
             ((tilts->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
              .array[0] * 3.141592653589793) / 180.0);
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       1.0;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  Utilities::generateRotationMatrix<double>
            (&local_1b8,&local_60,((double)local_598 * 3.141592653589793) / 180.0);
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       1.0;
  Utilities::generateRotationMatrix<double>(&local_208,&local_118,(double)local_568 / 180.0);
  if (local_580.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_580.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0x10;
    uVar8 = 0;
    do {
      dVar22 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6 + -0x10);
      dVar21 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6 + -8);
      dVar19 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6);
      pdVar1 = (double *)
               ((long)((local_580.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar6 + -0x10);
      *pdVar1 = dVar19 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[6] +
                dVar21 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[3] +
                dVar22 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[0];
      pdVar1[1] = dVar19 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[7] +
                  dVar21 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[4] +
                  dVar22 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[1];
      *(double *)
       ((long)((local_580.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar6) = dVar19 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[8] +
                dVar21 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[5] +
                dVar22 * local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[2];
      dVar22 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6 + -0x10);
      dVar21 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6 + -8);
      dVar19 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6);
      pdVar1 = (double *)
               ((long)((local_580.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar6 + -0x10);
      *pdVar1 = dVar19 * (double)local_418 + dVar21 * (double)local_558 + dVar22 * (double)local_548
      ;
      pdVar1[1] = dVar19 * (double)pvStack_410 +
                  dVar21 * (double)pMStack_550 + dVar22 * (double)pvStack_540;
      *(double *)
       ((long)((local_580.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar6) = dVar19 * (double)local_3a8 + dVar21 * (double)local_538 + dVar22 * (double)local_3b8
      ;
      dVar22 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6 + -0x10);
      dVar21 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6 + -8);
      dVar19 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6);
      pdVar1 = (double *)
               ((long)((local_580.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar6 + -0x10);
      *pdVar1 = dVar19 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[6] +
                dVar21 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[3] +
                dVar22 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[0];
      pdVar1[1] = dVar19 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[7] +
                  dVar21 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[4] +
                  dVar22 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[1];
      *(double *)
       ((long)((local_580.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar6) = dVar19 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[8] +
                dVar21 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[5] +
                dVar22 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[2];
      dVar22 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6 + -0x10);
      dVar21 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6 + -8);
      dVar19 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6);
      pdVar1 = (double *)
               ((long)((local_580.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar6 + -0x10);
      *pdVar1 = dVar19 * local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[6] +
                dVar21 * local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[3] +
                dVar22 * local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[0];
      pdVar1[1] = dVar19 * local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[7] +
                  dVar21 * local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[4] +
                  dVar22 * local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[1];
      *(double *)
       ((long)((local_580.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar6) = dVar19 * local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[8] +
                dVar21 * local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[5] +
                dVar22 * local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[2];
      dVar22 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6 + -0x10);
      dVar21 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6 + -8);
      dVar19 = *(double *)
                ((long)((local_580.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar6);
      pdVar1 = (double *)
               ((long)((local_580.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar6 + -0x10);
      *pdVar1 = dVar19 * local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[6] +
                dVar21 * local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[3] +
                dVar22 * local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[0];
      pdVar1[1] = dVar19 * local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[7] +
                  dVar21 * local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[4] +
                  dVar22 * local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[1];
      *(double *)
       ((long)((local_580.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar6) = dVar19 * local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[8] +
                dVar21 * local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[5] +
                dVar22 * local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[2];
      uVar8 = uVar8 + 1;
      uVar10 = ((long)local_580.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_580.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar6 = lVar6 + 0x18;
    } while (uVar8 <= uVar10 && uVar10 - uVar8 != 0);
  }
  calculateTiling(&local_580,
                  (local_520->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                  m_storage.m_data.array[0],
                  (local_520->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                  m_storage.m_data.array[1],
                  (local_520->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                  m_storage.m_data.array[2],&local_4fc,&local_5a4);
  local_598 = (pointer)CONCAT44(local_598._4_4_,
                                local_5a4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0]);
  local_568 = (pointer)CONCAT44(local_568._4_4_,
                                local_5a4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[1]);
  local_418 = (pointer)CONCAT44(local_418._4_4_,
                                local_4fc.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0]);
  local_548 = (pointer)CONCAT44(local_548._4_4_,
                                local_4fc.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[1]);
  local_538 = (pointer)CONCAT44(local_538._4_4_,
                                local_5a4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[2]);
  local_558 = (pointer)CONCAT44(local_558._4_4_,
                                local_4fc.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[2]);
  std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::vector(&local_430,&local_298.atoms);
  pAVar5 = local_430.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_430.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_430.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar11 = 0;
  }
  else {
    iVar11 = 0;
    pAVar9 = local_430.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      AtomSite::AtomSite(&local_4d8,pAVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_448,&local_4d8.element);
      pbVar4 = local_448.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar12 = local_448.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&local_460,&local_4d8.positions);
      uVar8 = (long)local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&local_460);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_448);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4d8.label);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4d8.element);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_4d8.positions);
      if (local_4d8.thermal_u.
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d8.thermal_u.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_4d8.thermal_u.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4d8.thermal_u.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_4d8.occupancy.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4d8.occupancy.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar11 = iVar11 + (int)((ulong)((long)pbVar4 - (long)pbVar12) >> 5) * (int)(uVar8 >> 3) *
                        -0x55555555;
      pAVar9 = pAVar9 + 1;
    } while (pAVar9 != pAVar5);
  }
  std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::~vector(&local_430);
  if ((((int)local_598 != (int)local_418) && ((int)local_568 != (int)local_548)) &&
     ((int)local_538 != (int)local_558)) {
    __new_size = (size_type)
                 (((int)local_538 - (int)local_558) * ((int)local_568 - (int)local_548) *
                 ((int)local_598 - (int)local_418) * iVar11);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(local_4f0,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(x,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(y,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(z,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(occ,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(ux,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(uy,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(uz,__new_size);
    std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::vector(&local_430,&local_298.atoms);
    uVar8 = 0;
    local_398 = local_430.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
                super__Vector_impl_data._M_finish;
    if (local_430.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_430.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        local_390 = local_430.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        AtomSite::AtomSite(&local_4d8,
                           local_430.
                           super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl
                           .super__Vector_impl_data._M_start);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&local_448,&local_4d8.positions);
        local_388 = local_448.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pbVar12 = local_448.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_448.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_448.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_460,(vector<double,_std::allocator<double>_> *)pbVar12);
            pMVar16 = local_580.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_528 = uVar8;
            local_380 = pbVar12;
            if (local_4fc.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data
                .array[2] <
                local_5a4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data
                .array[2]) {
              local_418 = (pointer)*local_460.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start;
              local_3a8 = (pointer)local_460.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[1];
              local_3b8 = (pointer)local_460.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[2];
              uStack_350 = 0;
              uStack_360 = 0;
              uStack_370 = 0;
              iVar11 = local_4fc.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage
                       .m_data.array[2];
              pvStack_410 = local_418;
              pdStack_3b0 = local_3b8;
              pvStack_3a0 = local_3a8;
              local_378 = local_3b8;
              local_368 = local_3a8;
              local_358 = local_418;
              do {
                pMVar20 = local_580.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_4e4 = iVar11;
                if (local_4fc.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[1] <
                    local_5a4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[1]) {
                  local_558 = (pointer)(double)iVar11;
                  uStack_340 = 0;
                  iVar11 = local_4fc.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[1];
                  pMStack_550 = local_558;
                  local_348 = local_558;
                  do {
                    pMVar2 = local_580.
                             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    local_4e0 = iVar11;
                    if (local_4fc.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[0] <
                        local_5a4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[0]) {
                      local_548 = (pointer)(double)iVar11;
                      uStack_330 = 0;
                      iVar11 = local_4fc.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[0];
                      pvStack_540 = local_548;
                      local_338 = (pointer)local_548;
                      do {
                        pMVar3 = local_580.
                                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        local_538 = (pointer)(double)iVar11;
                        uStack_320 = 0;
                        local_598 = (pointer)0x0;
                        local_568 = (pointer)0x0;
                        local_5b0 = 0;
                        pMStack_530 = local_538;
                        local_4dc = iVar11;
                        local_328 = local_538;
                        while( true ) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_518,&local_4d8.element);
                          lVar6 = (long)local_518.
                                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_518.
                                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_518);
                          if ((ulong)(lVar6 >> 5) <= local_5b0) break;
                          dVar22 = pMVar20[2].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[0] * (double)local_558 +
                                   pMVar2[1].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[0] * (double)local_548 +
                                   (pMVar3->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[0] * (double)local_538 +
                                   pMVar16[2].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[0] * (double)local_3b8 +
                                   pMVar16[1].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[0] * (double)local_3a8 +
                                   (pMVar16->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[0] * (double)local_418;
                          dVar21 = pMVar20[2].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[1] * (double)pMStack_550 +
                                   pMVar2[1].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[1] * (double)pvStack_540 +
                                   (pMVar3->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[1] * (double)pMStack_530 +
                                   pMVar16[2].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[1] * (double)pdStack_3b0 +
                                   pMVar16[1].
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[1] * (double)pvStack_3a0 +
                                   (pMVar16->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[1] * (double)pvStack_410;
                          if (((((0.0 <= dVar22) &&
                                (dVar22 <= (local_520->
                                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                           ).m_storage.m_data.array[0])) && (0.0 <= dVar21)) &&
                              ((dVar21 <= (local_520->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                          ).m_storage.m_data.array[1] &&
                               (dVar22 = pMVar20[2].
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         .m_storage.m_data.array[2] * (double)local_348 +
                                         pMVar2[1].
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         .m_storage.m_data.array[2] * (double)local_338 +
                                         (pMVar3->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         ).m_storage.m_data.array[2] * (double)local_328 +
                                         pMVar16[2].
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         .m_storage.m_data.array[2] * (double)local_378 +
                                         pMVar16[1].
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         .m_storage.m_data.array[2] * (double)local_368 +
                                         (pMVar16->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         ).m_storage.m_data.array[2] * (double)local_358,
                               0.0 <= dVar22)))) &&
                             (dVar22 <= (local_520->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                        ).m_storage.m_data.array[2])) {
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_518,&local_4d8.element);
                            lVar6 = (long)(int)local_528;
                            std::__cxx11::string::_M_assign
                                      ((string *)
                                       ((local_4f0->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar6));
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&local_518);
                            (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar6] =
                                 pMVar20[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] * (double)local_348 +
                                 pMVar2[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] * (double)local_338 +
                                 (pMVar3->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[0] * (double)local_328 +
                                 pMVar16[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] * (double)local_378 +
                                 pMVar16[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] * (double)local_368 +
                                 (pMVar16->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[0] * (double)local_358;
                            (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar6] =
                                 pMVar20[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] * (double)local_348 +
                                 pMVar2[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] * (double)local_338 +
                                 (pMVar3->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[1] * (double)local_328 +
                                 pMVar16[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] * (double)local_378 +
                                 pMVar16[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] * (double)local_368 +
                                 (pMVar16->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[1] * (double)local_358;
                            (z->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar6] =
                                 pMVar20[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] * (double)local_348 +
                                 pMVar2[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] * (double)local_338 +
                                 (pMVar3->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[2] * (double)local_328 +
                                 pMVar16[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] * (double)local_378 +
                                 pMVar16[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] * (double)local_368 +
                                 (pMVar16->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[2] * (double)local_358;
                            std::vector<double,_std::allocator<double>_>::vector
                                      ((vector<double,_std::allocator<double>_> *)&local_518,
                                       &local_4d8.occupancy);
                            (occ->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar6] =
                                 ((local_518.
                                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[local_5b0];
                            if (local_518.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_518.
                                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_518.
                                                                                                        
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_518.
                                                                                                            
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            std::
                            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ::vector(&local_518,&local_4d8.thermal_u);
                            (ux->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar6] =
                                 *(double *)
                                  ((long)((local_518.
                                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         ).m_storage.m_data.array + (long)local_598);
                            if (local_518.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_518.
                                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_518.
                                                                                                        
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_518.
                                                                                                            
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            std::
                            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ::vector(&local_518,&local_4d8.thermal_u);
                            (uy->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar6] =
                                 *(double *)
                                  ((long)((local_518.
                                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         ).m_storage.m_data.array + (long)local_598 + 8);
                            if (local_518.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_518.
                                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_518.
                                                                                                        
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_518.
                                                                                                            
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            std::
                            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ::vector(&local_518,&local_4d8.thermal_u);
                            (uz->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar6] =
                                 *(double *)
                                  ((long)((local_518.
                                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         ).m_storage.m_data.array + (long)local_598 + 0x10);
                            if (local_518.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_518.
                                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_518.
                                                                                                        
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_518.
                                                                                                            
                                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            local_528 = (ulong)((int)local_528 + 1);
                          }
                          local_5b0 = local_5b0 + 1;
                          local_568 = (pointer)((long)local_568 + 0x20);
                          local_598 = (pointer)((long)local_598 + 0x18);
                        }
                        iVar11 = local_4dc + 1;
                      } while (iVar11 < local_5a4.
                                        super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                        m_storage.m_data.array[0]);
                    }
                    iVar11 = local_4e0 + 1;
                  } while (iVar11 < local_5a4.
                                    super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[1]);
                }
                iVar11 = local_4e4 + 1;
              } while (iVar11 < local_5a4.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[2]);
            }
            if (local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_460.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_460.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            pbVar12 = (pointer)((local_380->field_2)._M_local_buf + 8);
            uVar8 = local_528;
          } while (pbVar12 != local_388);
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&local_448);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4d8.label);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4d8.element);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_4d8.positions);
        if (local_4d8.thermal_u.
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4d8.thermal_u.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_4d8.thermal_u.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_4d8.thermal_u.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4d8.occupancy.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_4d8.occupancy.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_4d8.occupancy.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        local_430.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
        super__Vector_impl_data._M_start = local_390 + 1;
      } while (local_430.super__Vector_base<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>._M_impl.
               super__Vector_impl_data._M_start != local_398);
      uVar8 = (ulong)(int)uVar8;
    }
    std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::~vector(&local_430);
    if ((((x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
          _M_start !=
          (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
          _M_finish) &&
        ((y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_start !=
         (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish)) &&
       ((z->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_start !=
        (z->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(local_4f0,uVar8);
      std::vector<double,_std::allocator<double>_>::resize(x,uVar8);
      std::vector<double,_std::allocator<double>_>::resize(y,uVar8);
      std::vector<double,_std::allocator<double>_>::resize(z,uVar8);
      std::vector<double,_std::allocator<double>_>::resize(occ,uVar8);
      std::vector<double,_std::allocator<double>_>::resize(ux,uVar8);
      std::vector<double,_std::allocator<double>_>::resize(uy,uVar8);
      std::vector<double,_std::allocator<double>_>::resize(uz,uVar8);
      if (local_580.
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_580.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_580.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_310.cvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_310.cvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_310.cvec.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_310.cvec.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_310.bvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_310.bvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_310.bvec.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_310.bvec.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_310.avec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_310.avec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_310.avec.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_310.avec.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::~vector(&local_298.atoms);
      if (local_298.geometry.cvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_298.geometry.cvec.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_298.geometry.cvec.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_298.geometry.cvec.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_298.geometry.bvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_298.geometry.bvec.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_298.geometry.bvec.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_298.geometry.bvec.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_298.geometry.avec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_298.geometry.avec.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_298.geometry.avec.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_298.geometry.avec.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Did not find any atoms inside limits");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"Did not find any atoms inside limits");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void makeSuperCell(Reader cif, Eigen::Vector3d uvw, Eigen::Vector3d abc, Eigen::Vector3d widths,
                       Eigen::Vector3d tilts, std::vector<std::string> &A, std::vector<double> &x, std::vector<double> &y,
                       std::vector<double> &z, std::vector<double> &occ, std::vector<double> &ux, std::vector<double> &uy,
                       std::vector<double> &uz) {
        // TODO: check that the uvw and abc vectors are no colinear
        UnitCell cell = cif.getUnitCell();

        auto geom = cell.getCellGeometry();
        auto a_vector = Eigen::Vector3d(geom.getAVector().data());
        auto b_vector = Eigen::Vector3d(geom.getBVector().data());
        auto c_vector = Eigen::Vector3d(geom.getCVector().data());

        // TODO: try to use more eigen matrices/vectors instead of stl
//    Eigen::Matrix3d basis;
//    basis << // use std::Vectors here?

        // for easy loopage
        // TODO: make this an eigen vector of eigen vectors
        std::vector<Eigen::Vector3d> basis = {a_vector, b_vector, c_vector};

        // this gives us the element type, occupancy and FRACTIONAL coords as well as the basis vectors
        // now we just need rotate them and tile them to fill the space

        // create vector from the zone axis we want
        Eigen::Vector3d uvw_vec = uvw(0) * a_vector + uvw(1) * b_vector + uvw(2) * c_vector;
        // create matrix with direction we want to map onto (here is is the z direction)
        Eigen::Vector3d z_direction(0.0, 0.0, 1.0);
        // create the rotation matrix
        auto za_rotation = Utilities::generateNormalisedRotationMatrix<double>(uvw_vec, z_direction);

        if (za_rotation.array().isNaN().sum() != 0) {
            throw std::runtime_error("Zone axis rotation matrix contains NaNs");
        }

        // similarly for rotation in x,y plane, though here we default to 0 rotation
        Eigen::Matrix3d xy_rotation = Eigen::Matrix3d::Identity();
        if ((abc.array() != 0).any()) {
            Eigen::Vector3d abc_vec = abc(0) * a_vector + abc(1) * b_vector + abc(2) * c_vector;
            abc_vec = za_rotation * abc_vec;
            abc_vec(2) = 0.0; // no rotate the z-axis!
            if (std::fabs(abc_vec(0)) < 1e-15)
                abc_vec(0) = 0.0;
            if (std::fabs(abc_vec(1)) < 1e-15)
                abc_vec(1) = 0.0;
            Eigen::Vector3d x_direction(1.0, 0.0, 0.0); // TODO: use << initialisation
            // Need the negative angle here? so give inputs in opposite order?
            if (x_direction.isApprox(-1 * abc_vec.normalized())) // note normalized() return a copy (that is normalized...)
                // Vectors are opposite, generate 180 rotation about z
                xy_rotation = Utilities::generateRotationMatrix<double>(z_direction, CIF::Utilities::pi);
            else
                // Generate rotation (returns correctly if vectors are in the same direction)
                xy_rotation = Utilities::generateNormalisedRotationMatrix<double>(x_direction, abc_vec);
        }

        if (xy_rotation.array().isNaN().sum() != 0) {
            throw std::runtime_error("Normal rotation matrix contains NaNs");
        }

        // convert angles to radians
        double alpha = tilts(0) * CIF::Utilities::pi / 180;
        double beta = tilts(1) * CIF::Utilities::pi / 180;
        double gamma = tilts(2) * CIF::Utilities::pi / 180;

        // generate the small rotation matrices
        auto x_rotation = Utilities::generateRotationMatrix<double>({1.0, 0.0, 0.0}, alpha);
        auto y_rotation = Utilities::generateRotationMatrix<double>({0.0, 1.0, 0.0}, beta);
        auto z_rotation = Utilities::generateRotationMatrix<double>({0.0, 0.0, 1.0}, gamma);

        for (int i = 0; i < basis.size(); ++i) {
            basis[i] = za_rotation * basis[i];
            basis[i] = xy_rotation * basis[i];
            basis[i] = x_rotation * basis[i];
            basis[i] = y_rotation * basis[i];
            basis[i] = z_rotation * basis[i];
        }

        Eigen::Vector3i mins, maxs;
        calculateTiling(basis, widths(0), widths(1), widths(2), mins, maxs);
        Eigen::Vector3i range = maxs - mins;

        // get total number of atoms in our xyz file
        int count = 0;
        for (auto at : cell.getAtoms())
            count += at.getElements().size() * at.getPositions().size();
        count = count * range(0) * range(1) * range(2);

        if ((range.array() == 0).any())
            throw std::runtime_error("Did not find any atoms inside limits");

        A.resize(count);
        x.resize(count);
        y.resize(count);
        z.resize(count);
        occ.resize(count);
        ux.resize(count);
        uy.resize(count);
        uz.resize(count);

        int it = 0;

        for (auto at : cell.getAtoms()) {
            for (auto pos : at.getPositions()) {
                // convert from fractional coordinates
                auto p = pos[0] * basis[0] + pos[1] * basis[1] + pos[2] * basis[2];

                for (int k = mins(2); k < maxs(2); ++k) {
                    auto k_factor = basis[2] * k;

                    for (int j = mins(1); j < maxs(1); ++j) {
                        auto j_factor = basis[1] * j;

                        for (int i = mins(0); i < maxs(0); ++i) {
                            auto i_factor = basis[0] * i;

                            auto new_pos = p + i_factor + j_factor + k_factor;

                            for (int ind = 0; ind < at.getElements().size(); ++ind) {

                                if (testInRange(new_pos, 0.0, widths(0), 0.0, widths(1), 0.0, widths(2))) {
                                    A[it] = at.getElements()[ind];
                                    x[it] = new_pos(0);
                                    y[it] = new_pos(1);
                                    z[it] = new_pos(2);
                                    occ[it] = at.getOccupancies()[ind];
                                    ux[it] = at.getThermals()[ind](0);
                                    uy[it] = at.getThermals()[ind](1);
                                    uz[it] = at.getThermals()[ind](2);

                                    ++it;
                                }
                            }
                        }
                    }
                }
            }
        }

        if (x.empty() || y.empty() || z.empty())
            throw std::runtime_error("Did not find any atoms inside limits");

        // resize back down to our valid entries
        A.resize(it);
        x.resize(it);
        y.resize(it);
        z.resize(it);
        occ.resize(it);
        ux.resize(it);
        uy.resize(it);
        uz.resize(it);
    }